

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O3

void FILEUnixToDosPathA(LPSTR lpPath)

{
  if (PAL_InitializeChakraCoreCalled) {
    if (lpPath == (LPSTR)0x0) {
      return;
    }
    do {
      if (*lpPath == '/') {
        *lpPath = '\\';
      }
      else if (*lpPath == '\0') goto code_r0x0032e4f8;
      lpPath = lpPath + 1;
    } while( true );
  }
LAB_0032e4ff:
  abort();
code_r0x0032e4f8:
  if (PAL_InitializeChakraCoreCalled != false) {
    return;
  }
  goto LAB_0032e4ff;
}

Assistant:

void
FILEUnixToDosPathA(
       LPSTR lpPath)
{
    LPSTR p;

    TRACE("Original Unix path = [%s]\n", lpPath);

    if (!lpPath)
        return;

    for (p = lpPath; *p; p++)
    {
        if (*p == '/')
            *p = '\\';
    }

    TRACE("Resulting DOS path = [%s]\n", lpPath);
}